

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiIniData * AddWindowSettings(char *name)

{
  int *piVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  ImGuiIniData *__dest;
  ImGuiContext *pIVar5;
  long lVar6;
  size_t sVar7;
  char *__dest_00;
  int iVar8;
  ImGuiIniData *pIVar9;
  int iVar10;
  
  pIVar3 = GImGui;
  iVar2 = (GImGui->Settings).Size;
  iVar10 = (GImGui->Settings).Capacity;
  iVar8 = iVar2 + 1;
  if (iVar2 < iVar10) goto LAB_0016d822;
  if (iVar10 == 0) {
    iVar10 = 8;
  }
  else {
    iVar10 = iVar10 / 2 + iVar10;
  }
  if (iVar10 <= iVar8) {
    iVar10 = iVar8;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImGuiIniData *)(*(pIVar3->IO).MemAllocFn)((long)iVar10 << 5);
  pIVar9 = (pIVar3->Settings).Data;
  if (pIVar9 == (ImGuiIniData *)0x0) {
LAB_0016d805:
    pIVar9 = (ImGuiIniData *)0x0;
    pIVar5 = GImGui;
  }
  else {
    memcpy(__dest,pIVar9,(long)(pIVar3->Settings).Size << 5);
    pIVar5 = GImGui;
    pIVar9 = (pIVar3->Settings).Data;
    if (pIVar9 == (ImGuiIniData *)0x0) goto LAB_0016d805;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar5->IO).MemFreeFn)(pIVar9);
  (pIVar3->Settings).Data = __dest;
  (pIVar3->Settings).Capacity = iVar10;
LAB_0016d822:
  pIVar5 = GImGui;
  (pIVar3->Settings).Size = iVar8;
  lVar6 = (long)(pIVar5->Settings).Size;
  if (lVar6 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x35d,"value_type &ImVector<ImGuiIniData>::back() [T = ImGuiIniData]");
  }
  pIVar9 = (pIVar5->Settings).Data;
  sVar7 = strlen(name);
  piVar1 = &(pIVar5->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest_00 = (char *)(*(pIVar5->IO).MemAllocFn)(sVar7 + 1);
  memcpy(__dest_00,name,sVar7 + 1);
  pIVar9[lVar6 + -1].Name = __dest_00;
  IVar4 = ImHash(name,0,0);
  pIVar9[lVar6 + -1].Id = IVar4;
  pIVar9[lVar6 + -1].Collapsed = false;
  pIVar9[lVar6 + -1].Pos.x = 3.4028235e+38;
  pIVar9[lVar6 + -1].Pos.y = 3.4028235e+38;
  pIVar9[lVar6 + -1].Size.x = 0.0;
  pIVar9[lVar6 + -1].Size.y = 0.0;
  return pIVar9 + lVar6 + -1;
}

Assistant:

static ImGuiIniData* AddWindowSettings(const char* name)
{
    GImGui->Settings.resize(GImGui->Settings.Size + 1);
    ImGuiIniData* ini = &GImGui->Settings.back();
    ini->Name = ImStrdup(name);
    ini->Id = ImHash(name, 0);
    ini->Collapsed = false;
    ini->Pos = ImVec2(FLT_MAX,FLT_MAX);
    ini->Size = ImVec2(0,0);
    return ini;
}